

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_image_color_brightness_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,int brightness,void *dst,rf_int dst_size)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  rf_color rVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  rf_color pixel_rgba32;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  if (image.valid == true) {
    iVar2 = rf_pixel_buffer_size(image.width,image.height,image.format);
    if (iVar2 <= dst_size) {
      iVar2 = -0xff;
      if (-0xff < brightness) {
        iVar2 = brightness;
      }
      if (0xfe < iVar2) {
        iVar2 = 0xff;
      }
      iVar3 = rf_bytes_per_pixel(image.format);
      uVar8 = (long)image.width;
      if ((long)image.width < 1) {
        uVar8 = 0;
      }
      uVar15 = (ulong)(uint)image.height;
      if (image.height < 1) {
        uVar15 = 0;
      }
      iVar13 = 0;
      uVar9 = 0;
      while( true ) {
        uVar16 = uVar8;
        iVar14 = iVar13;
        if (uVar9 == uVar15) break;
        while (bVar17 = uVar16 != 0, uVar16 = uVar16 - 1, bVar17) {
          rVar4 = rf_format_one_pixel_to_rgba32
                            ((void *)((long)image.data + (long)iVar14),image.format);
          iVar6 = ((uint)rVar4 & 0xff) + iVar2;
          iVar7 = ((uint)rVar4 >> 8 & 0xff) + iVar2;
          iVar5 = ((uint)rVar4 >> 0x10 & 0xff) + iVar2;
          iVar10 = 0xff;
          if (iVar6 < 0xff) {
            iVar10 = iVar6;
          }
          iVar11 = 0xff;
          if (iVar7 < 0xff) {
            iVar11 = iVar7;
          }
          iVar12 = 0xff;
          if (iVar5 < 0xff) {
            iVar12 = iVar5;
          }
          pixel_rgba32.r = (uchar)iVar10;
          if (iVar6 < 0) {
            pixel_rgba32.r = '\x01';
          }
          pixel_rgba32.g = (uchar)iVar11;
          if (iVar7 < 0) {
            pixel_rgba32.g = '\x01';
          }
          pixel_rgba32.b = (uchar)iVar12;
          if (iVar5 < 0) {
            pixel_rgba32.b = '\x01';
          }
          pixel_rgba32.a = rVar4.a;
          rf_format_one_pixel(&pixel_rgba32,RF_UNCOMPRESSED_R8G8B8A8,
                              (void *)((long)dst + (long)iVar14),image.format);
          iVar14 = iVar14 + iVar3;
        }
        uVar9 = uVar9 + 1;
        iVar13 = iVar13 + image.width * iVar3;
      }
      __return_storage_ptr__->data = image.data;
      __return_storage_ptr__->width = (int)image._8_8_;
      __return_storage_ptr__->height = (int)((ulong)image._8_8_ >> 0x20);
      uVar1 = image._16_8_;
      __return_storage_ptr__->format = (int)uVar1;
      __return_storage_ptr__->valid = (_Bool)(char)((ulong)uVar1 >> 0x20);
      *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
      __return_storage_ptr__->data = dst;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_color_brightness_to_buffer(rf_image image, int brightness, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            if (brightness < -255) brightness = -255;
            if (brightness > +255) brightness = +255;

            int bpp = rf_bytes_per_pixel(image.format);

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    int index = y * image.width + x;

                    void* src_pixel = ((unsigned char*)image.data) + index * bpp;
                    void* dst_pixel = ((unsigned char*)dst) + index * bpp;

                    rf_color pixel_rgba32 = rf_format_one_pixel_to_rgba32(src_pixel, image.format);

                    int c_r = pixel_rgba32.r + brightness;
                    int c_g = pixel_rgba32.g + brightness;
                    int c_b = pixel_rgba32.b + brightness;

                    if (c_r < 0) c_r = 1;
                    if (c_r > 255) c_r = 255;

                    if (c_g < 0) c_g = 1;
                    if (c_g > 255) c_g = 255;

                    if (c_b < 0) c_b = 1;
                    if (c_b > 255) c_b = 255;

                    pixel_rgba32.r = (unsigned char) c_r;
                    pixel_rgba32.g = (unsigned char) c_g;
                    pixel_rgba32.b = (unsigned char) c_b;

                    rf_format_one_pixel(&pixel_rgba32, RF_UNCOMPRESSED_R8G8B8A8, dst_pixel, image.format);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}